

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadConfigCfg.h
# Opt level: O0

void __thiscall
ConfigManager::Concretions::ReadConfigCfg::ReadConfigCfg(ReadConfigCfg *this,string *file_path)

{
  string *in_RSI;
  undefined8 *in_RDI;
  
  Interfaces::
  IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IReadConfig((IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x10b712);
  *in_RDI = &PTR__ReadConfigCfg_001a9be8;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

explicit ReadConfigCfg(std::string file_path)
        {
            m_file_path = file_path;
        }